

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall
ON_MeshFace::ComputeFaceNormal(ON_MeshFace *this,ON_3dPointListRef *vertex_list,ON_3dVector *FN)

{
  uint uVar1;
  double *pdVar2;
  float *pfVar3;
  double dVar4;
  bool bVar5;
  ulong uVar6;
  ON_3dVector b;
  ON_3dVector a;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  ON_3dPoint local_30;
  
  uVar1 = this->vi[2];
  local_60.x = -1.23432101234321e+308;
  local_60.y = -1.23432101234321e+308;
  local_78.x = -1.23432101234321e+308;
  local_60.z = -1.23432101234321e+308;
  if (uVar1 < vertex_list->m_point_count && -1 < (int)uVar1) {
    pdVar2 = vertex_list->m_dP;
    if (pdVar2 == (double *)0x0) {
      pfVar3 = vertex_list->m_fP;
      uVar6 = (ulong)(uVar1 * vertex_list->m_point_stride);
      local_60.x = (double)pfVar3[uVar6];
      local_60.y = (double)pfVar3[uVar6 + 1];
      local_60.z = (double)pfVar3[uVar6 + 2];
    }
    else {
      uVar6 = (ulong)(uVar1 * vertex_list->m_point_stride);
      local_60.x = pdVar2[uVar6];
      local_60.y = pdVar2[uVar6 + 1];
      local_60.z = pdVar2[uVar6 + 2];
    }
  }
  uVar1 = this->vi[0];
  local_78.y = -1.23432101234321e+308;
  local_78.z = -1.23432101234321e+308;
  if (uVar1 < vertex_list->m_point_count && -1 < (int)uVar1) {
    pdVar2 = vertex_list->m_dP;
    if (pdVar2 == (double *)0x0) {
      pfVar3 = vertex_list->m_fP;
      uVar6 = (ulong)(uVar1 * vertex_list->m_point_stride);
      local_78.x = (double)pfVar3[uVar6];
      local_78.y = (double)pfVar3[uVar6 + 1];
      local_78.z = (double)pfVar3[uVar6 + 2];
    }
    else {
      uVar6 = (ulong)(uVar1 * vertex_list->m_point_stride);
      local_78.x = pdVar2[uVar6];
      local_78.y = pdVar2[uVar6 + 1];
      local_78.z = pdVar2[uVar6 + 2];
    }
  }
  ON_3dPoint::operator-(&local_48,&local_60,&local_78);
  uVar1 = this->vi[3];
  local_30.x = -1.23432101234321e+308;
  local_78.x = -1.23432101234321e+308;
  local_78.y = -1.23432101234321e+308;
  local_30.y = -1.23432101234321e+308;
  local_78.z = -1.23432101234321e+308;
  if (uVar1 < vertex_list->m_point_count && -1 < (int)uVar1) {
    pdVar2 = vertex_list->m_dP;
    if (pdVar2 == (double *)0x0) {
      pfVar3 = vertex_list->m_fP;
      uVar6 = (ulong)(uVar1 * vertex_list->m_point_stride);
      local_78.x = (double)pfVar3[uVar6];
      local_78.y = (double)pfVar3[uVar6 + 1];
      local_78.z = (double)pfVar3[uVar6 + 2];
    }
    else {
      uVar6 = (ulong)(uVar1 * vertex_list->m_point_stride);
      local_78.x = pdVar2[uVar6];
      local_78.y = pdVar2[uVar6 + 1];
      local_78.z = pdVar2[uVar6 + 2];
    }
  }
  uVar1 = this->vi[1];
  local_30.z = -1.23432101234321e+308;
  if (uVar1 < vertex_list->m_point_count && -1 < (int)uVar1) {
    pdVar2 = vertex_list->m_dP;
    if (pdVar2 == (double *)0x0) {
      pfVar3 = vertex_list->m_fP;
      uVar6 = (ulong)(uVar1 * vertex_list->m_point_stride);
      local_30.x = (double)pfVar3[uVar6];
      local_30.y = (double)pfVar3[uVar6 + 1];
      local_30.z = (double)pfVar3[uVar6 + 2];
    }
    else {
      uVar6 = (ulong)(uVar1 * vertex_list->m_point_stride);
      local_30.x = pdVar2[uVar6];
      local_30.y = pdVar2[uVar6 + 1];
      local_30.z = pdVar2[uVar6 + 2];
    }
  }
  ON_3dPoint::operator-((ON_3dVector *)&local_60,&local_78,&local_30);
  ON_CrossProduct((ON_3dVector *)&local_78,&local_48,(ON_3dVector *)&local_60);
  FN->z = local_78.z;
  FN->x = local_78.x;
  FN->y = local_78.y;
  bVar5 = ON_3dVector::Unitize(FN);
  if (!bVar5) {
    FN->z = ON_3dVector::ZeroVector.z;
    dVar4 = ON_3dVector::ZeroVector.y;
    FN->x = ON_3dVector::ZeroVector.x;
    FN->y = dVar4;
  }
  return bVar5;
}

Assistant:

bool ON_MeshFace::ComputeFaceNormal( const class ON_3dPointListRef& vertex_list, ON_3dVector& FN ) const
{
  ON_3dVector a = vertex_list[vi[2]] - vertex_list[vi[0]];
  ON_3dVector b = vertex_list[vi[3]] - vertex_list[vi[1]];
  FN = ON_CrossProduct( a, b ); // works for triangles, quads, and nonplanar quads
  if ( FN.Unitize() )
    return true;

  FN = ON_3dVector::ZeroVector;
  return false;
}